

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetInitStep(void *arkode_mem,realtype hin)

{
  long in_RDI;
  double in_XMM0_Qa;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetInitStep","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      *(double *)(in_RDI + 0x160) = in_XMM0_Qa;
    }
    else {
      *(undefined8 *)(in_RDI + 0x160) = 0;
    }
    *(undefined8 *)(in_RDI + 0x228) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x40) = 0x3ff0000000000000;
    *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x48) = 0x3ff0000000000000;
    *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x50) = 0;
    *(undefined8 *)(*(long *)(in_RDI + 0x1b0) + 0x58) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetInitStep(void *arkode_mem, realtype hin)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetInitStep", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Passing hin=0 sets the default, otherwise use input. */
  if (hin == ZERO) {
    ark_mem->hin = ZERO;
  } else {
    ark_mem->hin = hin;
  }

  /* Clear previous initial step */
  ark_mem->h0u = ZERO;

  /* Clear error and step size history */
  ark_mem->hadapt_mem->ehist[0] = ONE;
  ark_mem->hadapt_mem->ehist[1] = ONE;
  ark_mem->hadapt_mem->hhist[0] = ZERO;
  ark_mem->hadapt_mem->hhist[1] = ZERO;

  return(ARK_SUCCESS);
}